

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O3

int mbedtls_camellia_crypt_ctr
              (mbedtls_camellia_context *ctx,size_t length,size_t *nc_off,uchar *nonce_counter,
              uchar *stream_block,uchar *input,uchar *output)

{
  uchar *puVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  int mode;
  
  mode = (int)length;
  sVar5 = *nc_off;
  if (length != 0) {
    do {
      if (sVar5 == 0) {
        mbedtls_camellia_crypt_ecb(ctx,mode,nonce_counter,stream_block);
        uVar4 = 0x10;
        do {
          puVar1 = nonce_counter + ((ulong)uVar4 - 1);
          *puVar1 = *puVar1 + '\x01';
          if (*puVar1 != '\0') break;
          bVar3 = 1 < uVar4;
          uVar4 = uVar4 - 1;
        } while (bVar3);
      }
      length = length - 1;
      bVar2 = *input;
      input = input + 1;
      *output = stream_block[sVar5] ^ bVar2;
      output = output + 1;
      sVar5 = (size_t)((int)sVar5 + 1U & 0xf);
    } while (length != 0);
  }
  *nc_off = sVar5;
  return 0;
}

Assistant:

int mbedtls_camellia_crypt_ctr( mbedtls_camellia_context *ctx,
                       size_t length,
                       size_t *nc_off,
                       unsigned char nonce_counter[16],
                       unsigned char stream_block[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c, i;
    size_t n = *nc_off;

    while( length-- )
    {
        if( n == 0 ) {
            mbedtls_camellia_crypt_ecb( ctx, MBEDTLS_CAMELLIA_ENCRYPT, nonce_counter,
                                stream_block );

            for( i = 16; i > 0; i-- )
                if( ++nonce_counter[i - 1] != 0 )
                    break;
        }
        c = *input++;
        *output++ = (unsigned char)( c ^ stream_block[n] );

        n = ( n + 1 ) & 0x0F;
    }

    *nc_off = n;

    return( 0 );
}